

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

map * __thiscall implementations::scheme::environment::find(environment *this,string *var)

{
  bool bVar1;
  element_type *this_00;
  ostream *poVar2;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *var_local;
  environment *this_local;
  
  local_20 = var;
  var_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
       ::find(&this->env_,var);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
       ::end(&this->env_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    this_local = (environment *)&this->env_;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->outer_);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"unbound symbol \'");
      poVar2 = std::operator<<(poVar2,(string *)local_20);
      std::operator<<(poVar2,"\'\n");
      exit(1);
    }
    this_00 = std::
              __shared_ptr_access<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->outer_);
    this_local = (environment *)find(this_00,local_20);
  }
  return (map *)this_local;
}

Assistant:

map & find(const std::string & var)
	{
		if (env_.find(var) != env_.end())
			return env_; // the symbol exists in this environment
		if (outer_)
			return outer_->find(var); // attempt to find the symbol in some "outer" env
		std::cout << "unbound symbol '" << var << "'\n";
		exit(1);
	}